

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

RTPTime __thiscall jrtplib::RTCPScheduler::CalculateBYETransmissionInterval(RTCPScheduler *this)

{
  size_t sVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  double local_78;
  double T;
  double mul;
  double Td;
  double ntimesC;
  double tmin;
  RTPTime Tmin;
  double n;
  double C;
  RTCPScheduler *this_local;
  
  if ((this->byescheduled & 1U) == 0) {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  else if ((this->sendbyenow & 1U) == 0) {
    sVar1 = this->avgbyepacketsize;
    auVar5._8_4_ = (int)(sVar1 >> 0x20);
    auVar5._0_8_ = sVar1;
    auVar5._12_4_ = 0x45300000;
    dVar3 = RTCPSchedulerParams::GetSenderBandwidthFraction(&this->schedparams);
    dVar4 = RTCPSchedulerParams::GetRTCPBandwidth(&this->schedparams);
    Tmin.m_t = (double)this->byemembers;
    tmin = (double)RTCPSchedulerParams::GetMinimumTransmissionInterval(&this->schedparams);
    ntimesC = RTPTime::GetDouble((RTPTime *)&tmin);
    bVar2 = RTCPSchedulerParams::GetUseHalfAtStartup(&this->schedparams);
    if (bVar2) {
      ntimesC = ntimesC / 2.0;
    }
    local_78 = Tmin.m_t *
               (((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
               ((1.0 - dVar3) * dVar4));
    if (local_78 < ntimesC) {
      local_78 = ntimesC;
    }
    (*this->rtprand->_vptr_RTPRandom[5])();
    RTPTime::RTPTime((RTPTime *)&this_local,(local_78 * (extraout_XMM0_Qa + 0.5)) / 1.21828);
  }
  else {
    RTPTime::RTPTime((RTPTime *)&this_local,0,0);
  }
  return (RTPTime)(double)this_local;
}

Assistant:

RTPTime RTCPScheduler::CalculateBYETransmissionInterval()
{
	if (!byescheduled)
		return RTPTime(0,0);
	
	if (sendbyenow)
		return RTPTime(0,0);
	
	double C,n;

	C = ((double)avgbyepacketsize)/((1.0-schedparams.GetSenderBandwidthFraction())*schedparams.GetRTCPBandwidth());
	n = (double)byemembers;
	
	RTPTime Tmin = schedparams.GetMinimumTransmissionInterval();
	double tmin = Tmin.GetDouble();
	
	if (schedparams.GetUseHalfAtStartup())
		tmin /= 2.0;

	double ntimesC = n*C;
	double Td = (tmin>ntimesC)?tmin:ntimesC;

	double mul = rtprand.GetRandomDouble()+0.5; // gives random value between 0.5 and 1.5
	double T = (Td*mul)/1.21828; // see RFC 3550 p 30
	
	return RTPTime(T);
}